

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

uint32_t lyd_list_pos(lyd_node *instance)

{
  uint32_t local_24;
  lyd_node *plStack_20;
  uint32_t pos;
  lyd_node *iter;
  lyd_node *instance_local;
  
  local_24 = 0;
  if ((instance == (lyd_node *)0x0) ||
     (plStack_20 = instance, (instance->schema->nodetype & 0x18) == 0)) {
    instance_local._4_4_ = 0;
  }
  else {
    for (; (plStack_20->schema == instance->schema &&
           ((local_24 == 0 || (plStack_20->next != (lyd_node *)0x0))));
        plStack_20 = plStack_20->prev) {
      local_24 = local_24 + 1;
    }
    instance_local._4_4_ = local_24;
  }
  return instance_local._4_4_;
}

Assistant:

LIBYANG_API_DEF uint32_t
lyd_list_pos(const struct lyd_node *instance)
{
    const struct lyd_node *iter = NULL;
    uint32_t pos = 0;

    if (!instance || !(instance->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))) {
        return 0;
    }

    /* data instances are ordered, so we can stop when we found instance of other schema node */
    for (iter = instance; iter->schema == instance->schema; iter = iter->prev) {
        if (pos && (iter->next == NULL)) {
            /* overrun to the end of the siblings list */
            break;
        }
        ++pos;
    }

    return pos;
}